

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_xvcmpgtsp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_ptr arg2;
  TCGv_ptr arg3;
  TCGv_ptr arg4;
  TCGv_i32 retval;
  TCGv_ptr xb;
  TCGv_ptr xa;
  TCGv_ptr xt;
  TCGv_i32 ignored;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->vsx_enabled ^ 0xffU) & 1) == 0) {
    uVar1 = xT(ctx->opcode);
    arg2 = gen_vsr_ptr(tcg_ctx_00,uVar1);
    uVar1 = xA(ctx->opcode);
    arg3 = gen_vsr_ptr(tcg_ctx_00,uVar1);
    uVar1 = xB(ctx->opcode);
    arg4 = gen_vsr_ptr(tcg_ctx_00,uVar1);
    if ((ctx->opcode >> 10 & 1) == 0) {
      retval = tcg_temp_new_i32(tcg_ctx_00);
      gen_helper_xvcmpgtsp(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,arg2,arg3,arg4);
      tcg_temp_free_i32(tcg_ctx_00,retval);
    }
    else {
      gen_helper_xvcmpgtsp(tcg_ctx_00,cpu_crf[6],tcg_ctx_00->cpu_env,arg2,arg3,arg4);
    }
    gen_helper_float_check_status(tcg_ctx_00,tcg_ctx_00->cpu_env);
    tcg_temp_free_ptr(tcg_ctx_00,arg2);
    tcg_temp_free_ptr(tcg_ctx_00,arg3);
    tcg_temp_free_ptr(tcg_ctx_00,arg4);
  }
  else {
    gen_exception(ctx,0x5e);
  }
  return;
}

Assistant:

static void gen_xscvqpdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 opc;
    TCGv_ptr xt, xb;
    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    opc = tcg_const_i32(tcg_ctx, ctx->opcode);
    xt = gen_vsr_ptr(tcg_ctx, xT(ctx->opcode));
    xb = gen_vsr_ptr(tcg_ctx, xB(ctx->opcode));
    gen_helper_xscvqpdp(tcg_ctx, tcg_ctx->cpu_env, opc, xt, xb);
    tcg_temp_free_i32(tcg_ctx, opc);
    tcg_temp_free_ptr(tcg_ctx, xt);
    tcg_temp_free_ptr(tcg_ctx, xb);
}